

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_string.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_1403f7::JsonString::JsonString(JsonString *this)

{
  JsonString *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__JsonString_0025c2a8;
  testing::StrictMock<mock_json_callbacks>::StrictMock(&this->callbacks_);
  callbacks_proxy<mock_json_callbacks>::callbacks_proxy
            (&this->proxy_,&(this->callbacks_).super_mock_json_callbacks);
  return;
}

Assistant:

JsonString ()
                : proxy_{callbacks_} {}